

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeThrow(TranslateToFuzzReader *this,Type type)

{
  char *pcVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  Tag *tag;
  value_type *pvVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  Throw *pTVar6;
  Module *pMVar7;
  undefined1 auVar8 [8];
  Name name;
  Name NVar9;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  string_view local_90;
  HeapType local_80;
  Type local_78;
  Type tagType;
  undefined1 local_58 [8];
  Iterator __begin1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  
  if (type.id != 1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1438,"Expression *wasm::TranslateToFuzzReader::makeThrow(Type)");
  }
  if (this->trivialNesting == 0) {
    pMVar7 = this->wasm;
    if (*(long *)(pMVar7 + 0x48) == *(long *)(pMVar7 + 0x50)) {
      addTag(this);
      pMVar7 = this->wasm;
    }
    pvVar3 = Random::
             pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                       (&this->random,
                        (vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                         *)(pMVar7 + 0x48));
    tag = (pvVar3->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
          super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
  }
  else if ((this->trivialTag).super_IString.str._M_str == (char *)0x0) {
    pMVar7 = this->wasm;
    Name::Name((Name *)&local_90,"tag$");
    NVar9 = Names::getValidTagName(pMVar7,(Name)local_90);
    wasm::HeapType::HeapType(&local_80,(Signature)ZEXT816(0));
    name.super_IString.str._M_str = NVar9.super_IString.str._M_len;
    name.super_IString.str._M_len =
         (size_t)&__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
    ;
    Builder::makeTag(name,(HeapType)NVar9.super_IString.str._M_str);
    tag = (Tag *)wasm::Module::addTag((unique_ptr *)this->wasm);
    pcVar1 = *(char **)((long)&(tag->super_Importable).super_Named.name.super_IString.str + 8);
    (this->trivialTag).super_IString.str._M_len =
         (tag->super_Importable).super_Named.name.super_IString.str._M_len;
    (this->trivialTag).super_IString.str._M_str = pcVar1;
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
              ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
               &__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
  }
  else {
    NVar9.super_IString.str._M_str = (char *)(this->trivialTag).super_IString.str._M_len;
    NVar9.super_IString.str._M_len = (size_t)this->wasm;
    tag = (Tag *)wasm::Module::getTag(NVar9);
  }
  local_78.id = wasm::HeapType::getSignature();
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_58 = (undefined1  [8])&local_78;
  PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_78);
  pTVar4 = (Type *)0x0;
  auVar8 = (undefined1  [8])&local_78;
  while (PVar2.index = (size_t)pTVar4, PVar2.parent = (Type *)auVar8, PVar10 != PVar2) {
    puVar5 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_58);
    tagType.id = (uintptr_t)make(this,*puVar5);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
               &__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               (Expression **)&tagType);
    pTVar4 = (Type *)((long)&(__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
    auVar8 = local_58;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar4;
  }
  pTVar6 = Builder::makeThrow(&this->builder,tag,
                              (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                              &__begin1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
  return (Expression *)pTVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeThrow(Type type) {
  assert(type == Type::unreachable);
  Tag* tag;
  if (trivialNesting) {
    // We are nested under a makeTrivial call, so only emit something trivial.
    // Get (or create) a trivial tag, so we have no operands (and will not call
    // make(), below). Otherwise, we might recurse very deeply if we threw a
    // tag that contains an exnref (for which we may end up creating yet another
    // throw in a try).
    if (!trivialTag) {
      auto newTag = builder.makeTag(Names::getValidTagName(wasm, "tag$"),
                                    Signature(Type::none, Type::none));
      tag = wasm.addTag(std::move(newTag));
      trivialTag = tag->name;
    } else {
      tag = wasm.getTag(trivialTag);
    }
  } else {
    // Get a random tag, adding a random one if necessary.
    if (wasm.tags.empty()) {
      addTag();
    }
    tag = pick(wasm.tags).get();
  }
  auto tagType = tag->params();
  std::vector<Expression*> operands;
  for (auto t : tagType) {
    operands.push_back(make(t));
  }
  return builder.makeThrow(tag, operands);
}